

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::TestGroup::TestGroup(TestGroup *this,Context *ctx)

{
  FormatExtEntries extRange_00;
  FormatEntries fmtRange;
  TestContext *testCtx;
  RenderContext *renderCtx;
  FormatExtEntries extRange;
  FormatEntries stdRange;
  Context *ctx_local;
  TestGroup *this_local;
  
  TestCaseGroup::TestCaseGroup(&this->super_TestCaseGroup,ctx,"completeness","Completeness tests");
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestGroup_032a2278;
  (this->m_checkerFactory).super_CheckerFactory._vptr_CheckerFactory = (_func_int **)0x0;
  ES3CheckerFactory::ES3CheckerFactory(&this->m_checkerFactory);
  testCtx = gles3::Context::getTestContext(ctx);
  renderCtx = gles3::Context::getRenderContext(ctx);
  deqp::gls::fboc::details::Context::Context
            (&this->m_fboc,testCtx,renderCtx,&(this->m_checkerFactory).super_CheckerFactory);
  fmtRange.m_end =
       (Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_> *)&DAT_033bbe08;
  fmtRange.m_begin =
       (Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_> *)s_es3Formats;
  deqp::gls::fboc::details::Context::addFormats(&this->m_fboc,fmtRange);
  extRange_00.m_end = (FormatExtEntry *)s_swizzles;
  extRange_00.m_begin = (FormatExtEntry *)s_es3ExtFormats;
  deqp::gls::fboc::details::Context::addExtFormats(&this->m_fboc,extRange_00);
  deqp::gls::fboc::details::Context::setHaveMulticolorAtts(&this->m_fboc,true);
  return;
}

Assistant:

TestGroup::TestGroup (Context& ctx)
	: TestCaseGroup		(ctx, "completeness", "Completeness tests")
	, m_checkerFactory	()
	, m_fboc			(ctx.getTestContext(), ctx.getRenderContext(), m_checkerFactory)
{
	const FormatEntries stdRange = GLS_ARRAY_RANGE(s_es3Formats);
	const FormatExtEntries extRange = GLS_ARRAY_RANGE(s_es3ExtFormats);

	m_fboc.addFormats(stdRange);
	m_fboc.addExtFormats(extRange);
	m_fboc.setHaveMulticolorAtts(true); // Vanilla ES3 has multiple color attachments
}